

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_ADDPL(DisasContext_conflict1 *s,arg_ADDPL *a)

{
  int iVar1;
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var2;
  int iVar3;
  TCGv_i64 ret;
  TCGv_i64 arg1;
  TCGv_i64 rn;
  TCGv_i64 rd;
  TCGContext_conflict1 *tcg_ctx;
  arg_ADDPL *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var2 = sve_access_check_aarch64(s);
  if (_Var2) {
    ret = cpu_reg_sp_aarch64(s,a->rd);
    arg1 = cpu_reg_sp_aarch64(s,a->rn);
    iVar1 = a->imm;
    iVar3 = pred_full_reg_size(s);
    tcg_gen_addi_i64_aarch64(tcg_ctx_00,ret,arg1,(long)(iVar1 * iVar3));
  }
  return true;
}

Assistant:

static bool trans_ADDPL(DisasContext *s, arg_ADDPL *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        TCGv_i64 rd = cpu_reg_sp(s, a->rd);
        TCGv_i64 rn = cpu_reg_sp(s, a->rn);
        tcg_gen_addi_i64(tcg_ctx, rd, rn, a->imm * pred_full_reg_size(s));
    }
    return true;
}